

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void * __thiscall
c4::MemoryResourceLinear::do_allocate
          (MemoryResourceLinear *this,size_t sz,size_t alignment,void *hint)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (sz == 0) {
    return (void *)0x0;
  }
  uVar1 = (this->super__MemoryResourceSingleChunk).m_size;
  uVar9 = (this->super__MemoryResourceSingleChunk).m_pos;
  if (uVar1 < sz + uVar9) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      pvVar4 = (void *)(*pcVar2)();
      return pvVar4;
    }
    pcVar5 = "out of memory";
    uVar7 = 0x445a;
  }
  else {
    pcVar5 = (this->super__MemoryResourceSingleChunk).m_mem + uVar9;
    uVar8 = uVar1 - uVar9;
    bVar3 = true;
    if (sz <= uVar8) {
      pcVar6 = (char *)(-alignment & (ulong)(pcVar5 + (alignment - 1)));
      if ((ulong)((long)pcVar6 - (long)pcVar5) <= uVar8 - sz) {
        uVar8 = uVar8 - ((long)pcVar6 - (long)pcVar5);
        bVar3 = pcVar6 == (char *)0x0;
        pcVar5 = pcVar6;
      }
    }
    if (!bVar3) {
      if (uVar1 < uVar9) {
        do_allocate();
      }
      if ((this->super__MemoryResourceSingleChunk).m_size -
          (this->super__MemoryResourceSingleChunk).m_pos < uVar8) {
        do_allocate();
      }
      uVar1 = (this->super__MemoryResourceSingleChunk).m_size;
      uVar9 = (sz - uVar8) + uVar1;
      (this->super__MemoryResourceSingleChunk).m_pos = uVar9;
      if (uVar9 <= uVar1) {
        return pcVar5;
      }
      do_allocate();
      return pcVar5;
    }
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      pvVar4 = (void *)(*pcVar2)();
      return pvVar4;
    }
    pcVar5 = "could not align memory";
    uVar7 = 0x4469;
  }
  handle_error(pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,uVar7);
}

Assistant:

void* MemoryResourceLinear::do_allocate(size_t sz, size_t alignment, void *hint)
{
    C4_UNUSED(hint);
    if(sz == 0) return nullptr;
    // make sure there's enough room to allocate
    if(m_pos + sz > m_size)
    {
        C4_ERROR("out of memory");
        return nullptr;
    }
    void *mem = m_mem + m_pos;
    size_t space = m_size - m_pos;
    if(std::align(alignment, sz, mem, space))
    {
        C4_ASSERT(m_pos <= m_size);
        C4_ASSERT(m_size - m_pos >= space);
        m_pos += (m_size - m_pos) - space;
        m_pos += sz;
        C4_ASSERT(m_pos <= m_size);
    }
    else
    {
        C4_ERROR("could not align memory");
        mem = nullptr;
    }
    return mem;
}